

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O0

shared_ptr<SchemePort>
get_input_port(list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
               *l,string *proc)

{
  bool bVar1;
  size_type sVar2;
  element_type *peVar3;
  eval_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<SchemePort> sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  shared_ptr<SchemeObject> local_38;
  undefined1 local_21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  string *proc_local;
  list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_> *l_local;
  shared_ptr<SchemePort> *port;
  
  local_21 = 0;
  local_20 = in_RDX;
  proc_local = proc;
  l_local = l;
  std::shared_ptr<SchemePort>::shared_ptr((shared_ptr<SchemePort> *)l,&current_input_port);
  sVar2 = std::__cxx11::
          list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>::size
                    ((list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                      *)proc_local);
  if (sVar2 != 0) {
    std::__cxx11::
    list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>::front
              ((list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                *)proc_local);
    std::dynamic_pointer_cast<SchemePort,SchemeObject>(&local_38);
    std::shared_ptr<SchemePort>::operator=
              ((shared_ptr<SchemePort> *)l,(shared_ptr<SchemePort> *)&local_38);
    std::shared_ptr<SchemePort>::~shared_ptr((shared_ptr<SchemePort> *)&local_38);
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)l);
  if (bVar1) {
    peVar3 = std::__shared_ptr_access<SchemePort,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<SchemePort,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )l);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&peVar3->input_stream);
    if (bVar1) {
      sVar4.super___shared_ptr<SchemePort,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      sVar4.super___shared_ptr<SchemePort,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)l;
      return (shared_ptr<SchemePort>)
             sVar4.super___shared_ptr<SchemePort,_(__gnu_cxx::_Lock_policy)2>;
    }
  }
  this = (eval_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_58,local_20,": bad port");
  eval_error::runtime_error(this,&local_58);
  __cxa_throw(this,&eval_error::typeinfo,eval_error::~eval_error);
}

Assistant:

static std::shared_ptr<SchemePort>
get_input_port(const std::list<std::shared_ptr<SchemeObject>> &l, const std::string &proc)
{
    auto port = current_input_port;
    if(l.size())
        port = std::dynamic_pointer_cast<SchemePort>(l.front());
    if(!port || !port->input_stream)
        throw eval_error(proc + ": bad port");
    return port;
}